

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  string local_30;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,5);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,"  ",2);
    poVar1 = this->stream;
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_30,this->result);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->stream,"\n",1);
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    Colour colourGuard( Colour::OriginalExpression );
                    stream  << "  ";
                    stream << result.getExpressionInMacro();
                    stream << "\n";
                }
            }